

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextengine.cpp
# Opt level: O2

void __thiscall QTextEngine::addRequiredBoundaries(QTextEngine *this)

{
  FormatRange *pFVar1;
  SpecialData *pSVar2;
  long lVar3;
  int i;
  ulong uVar4;
  
  pSVar2 = this->specialData;
  if (pSVar2 != (SpecialData *)0x0) {
    lVar3 = 0;
    for (uVar4 = 0; uVar4 < (ulong)(pSVar2->formats).d.size; uVar4 = uVar4 + 1) {
      pFVar1 = (pSVar2->formats).d.ptr;
      setBoundary(this,*(int *)((long)&pFVar1->start + lVar3));
      setBoundary(this,*(int *)((long)&pFVar1->length + lVar3) +
                       *(int *)((long)&pFVar1->start + lVar3));
      pSVar2 = this->specialData;
      lVar3 = lVar3 + 0x18;
    }
  }
  return;
}

Assistant:

void QTextEngine::addRequiredBoundaries() const
{
    if (specialData) {
        for (int i = 0; i < specialData->formats.size(); ++i) {
            const QTextLayout::FormatRange &r = specialData->formats.at(i);
            setBoundary(r.start);
            setBoundary(r.start + r.length);
            //qDebug("adding boundaries %d %d", r.start, r.start+r.length);
        }
    }
}